

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

Options * __thiscall ApprovalTests::Options::withReporter(Options *this,Reporter *reporter)

{
  shared_ptr<ApprovalTests::ApprovalNamer> *in_RDX;
  FileOptions *in_RSI;
  Options *in_RDI;
  FileOptions *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff58;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff60;
  undefined1 usingDefaultScrubber;
  Options *scrubber;
  Options *in_stack_ffffffffffffff80;
  
  scrubber = in_RDI;
  FileOptions::FileOptions
            ((FileOptions *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  usingDefaultScrubber = (undefined1)((ulong)&stack0xffffffffffffff80 >> 0x38);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)
             (ulong)CONCAT14((char)in_RSI[2].fileExtensionWithDot_._M_string_length,
                             in_stack_ffffffffffffff50),
             (shared_ptr<ApprovalTests::ApprovalNamer> *)in_stack_ffffffffffffff48);
  Options(in_stack_ffffffffffffff80,in_RSI,(Scrubber *)scrubber,(Reporter *)in_RDI,
          (bool)usingDefaultScrubber,in_RDX);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x11a2fb);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11a305);
  FileOptions::~FileOptions((FileOptions *)0x11a30f);
  return scrubber;
}

Assistant:

Options Options::withReporter(const Reporter& reporter) const
    {
        return Options(fileOptions_, scrubber_, reporter, usingDefaultScrubber_, namer_);
    }